

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O0

void __thiscall
CryptoUtil_EncryptAes256CbcDataEmpty_Test::~CryptoUtil_EncryptAes256CbcDataEmpty_Test
          (CryptoUtil_EncryptAes256CbcDataEmpty_Test *this)

{
  CryptoUtil_EncryptAes256CbcDataEmpty_Test *this_local;
  
  ~CryptoUtil_EncryptAes256CbcDataEmpty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CryptoUtil, EncryptAes256CbcDataEmpty) {
  try {
    ByteData key(
        "616975656F616975656F616975656F616975656F616975656F616975656F6169");
    ByteData iv("34567890123456789012345678901234");
    std::string data;
    ByteData byte_data = CryptoUtil::EncryptAes256Cbc(key.GetBytes(),
                                                      iv.GetBytes(), data);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "EncryptAes256Cbc data isEmpty.");
    return;
  }
  ASSERT_TRUE(false);
}